

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O2

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int _h;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Mat local_88;
  int local_3c;
  Option *local_38;
  
  iVar7 = bottom_blob->dims;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar12 = this->expand_w != 0;
    bVar13 = this->expand_h != 0;
    bVar14 = this->expand_c != 0;
  }
  else {
    uVar1 = (this->axes).w;
    uVar9 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar9;
    }
    bVar12 = false;
    bVar13 = false;
    bVar14 = false;
    for (; local_38 = opt, uVar8 != uVar9; uVar9 = uVar9 + 1) {
      bVar11 = iVar7 == 2;
      iVar10 = *(int *)((long)pvVar2 + uVar9 * 4);
      iVar10 = (iVar10 >> 0x1f & iVar7 + 1U) + iVar10;
      bVar14 = (bool)(bVar14 | (iVar10 == 0 && bVar11));
      bVar13 = (bool)(bVar13 | (iVar10 == 1 && bVar11 || iVar7 == 1 && iVar10 == 0));
      bVar12 = (bool)(bVar12 | (iVar10 == 2 && bVar11 || iVar7 == 1 && iVar10 == 1));
    }
  }
  iVar10 = bottom_blob->w;
  _h = bottom_blob->h;
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        local_38 = (Option *)CONCAT44(local_38._4_4_,iVar10);
        local_3c = _h;
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
        iVar10 = (int)local_38;
        _h = local_3c;
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar4 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    iVar6 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar4;
    top_blob->h = iVar5;
    top_blob->d = iVar6;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (iVar7 == 2) {
    if (bVar12) {
      Mat::reshape(&local_88,bottom_blob,1,iVar10,_h,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
    else if (bVar13) {
      Mat::reshape(&local_88,bottom_blob,iVar10,1,_h,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
    else {
      if (!bVar14) goto LAB_004020cc;
      Mat::reshape(&local_88,bottom_blob,iVar10,_h,1,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
  }
  else {
    if (iVar7 != 1) goto LAB_004020cc;
    if ((bool)(bVar12 & bVar13)) {
      Mat::reshape(&local_88,bottom_blob,1,iVar10,1,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
    else if (bVar12) {
      Mat::reshape(&local_88,bottom_blob,1,iVar10,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
    else {
      if (!bVar13) goto LAB_004020cc;
      Mat::reshape(&local_88,bottom_blob,iVar10,1,opt->blob_allocator);
      if (&local_88 != top_blob) {
        if (local_88.refcount != (int *)0x0) {
          LOCK();
          *local_88.refcount = *local_88.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_88.data;
        top_blob->refcount = local_88.refcount;
        top_blob->elemsize = local_88.elemsize;
        top_blob->elempack = local_88.elempack;
        top_blob->allocator = local_88.allocator;
        top_blob->dims = local_88.dims;
        top_blob->w = local_88.w;
        top_blob->h = local_88.h;
        top_blob->d = local_88.d;
        top_blob->c = local_88.c;
        top_blob->cstep = local_88.cstep;
      }
      if (local_88.refcount == (int *)0x0) goto LAB_004020cc;
      LOCK();
      *local_88.refcount = *local_88.refcount + -1;
      UNLOCK();
      if (*local_88.refcount != 0) goto LAB_004020cc;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        goto LAB_004020cc;
      }
    }
  }
  free(local_88.data);
LAB_004020cc:
  if ((top_blob->data == (void *)0x0) || (iVar7 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar7 = -100;
  }
  return iVar7;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}